

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

SectorSpan Storage::Encodings::AppleGCR::Macintosh::sectors_in_track(int track)

{
  SectorSpan SVar1;
  int iVar2;
  int prior_sectors;
  int zone;
  int track_local;
  SectorSpan result;
  
  iVar2 = track >> 4;
  SVar1.length = 0xc - iVar2;
  SVar1.start = (iVar2 * 0x10 * (0x18 - (iVar2 + -1))) / 2 + (track & 0xfU) * (0xc - iVar2);
  return SVar1;
}

Assistant:

AppleGCR::Macintosh::SectorSpan AppleGCR::Macintosh::sectors_in_track(int track) {
	// A Macintosh disk has 80 tracks, divided into 5 16-track zones. The outermost
	// zone has 12 sectors/track, the next one in has only 11 sectors/track, and
	// that arithmetic progression continues.
	//
	// (... and therefore the elementary sum of an arithmetic progression formula
	// is deployed below)
	const int zone = track >> 4;
	const int prior_sectors = 16 * zone * (12 + (12 - (zone - 1))) / 2;

	AppleGCR::Macintosh::SectorSpan result;
	result.length = 12 - zone;
	result.start = prior_sectors + (track & 15) * result.length;

	return result;
}